

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

hts_itr_t * cram_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  int iVar1;
  int local_4c;
  int local_48;
  cram_range r;
  hts_itr_t *iter;
  hts_cram_idx_t *cidx;
  hts_readrec_func *readrec_local;
  int end_local;
  int beg_local;
  int tid_local;
  hts_idx_t *idx_local;
  
  r._4_8_ = calloc(1,0x50);
  if ((uint *)r._4_8_ == (uint *)0x0) {
    idx_local = (hts_idx_t *)0x0;
  }
  else {
    *(uint *)r._4_8_ = *(uint *)r._4_8_ & 0xfffffffe | 1;
    *(uint *)(r._4_8_ + 0x30) = 0;
    *(uint *)(r._4_8_ + 0x34) = 0;
    *(uint *)(r._4_8_ + 0x48) = 0;
    *(uint *)(r._4_8_ + 0x4c) = 0;
    *(hts_readrec_func **)(r._4_8_ + 0x38) = readrec;
    if (tid < 0) {
      if (tid == -5) {
        *(uint *)(r._4_8_ + 0x28) = 0;
        *(uint *)(r._4_8_ + 0x2c) = 0;
        *(uint *)r._4_8_ = *(uint *)r._4_8_ & 0xfffffffd | 2;
      }
      else {
        if (tid != -4) {
          fprintf(_stderr,"[cram_itr_query] tid=%d not implemented for CRAM files -- Exiting\n",
                  (ulong)(uint)tid);
          abort();
        }
        *(uint *)(r._4_8_ + 0x28) = 0;
        *(uint *)(r._4_8_ + 0x2c) = 0;
      }
    }
    else {
      local_48 = beg + 1;
      local_4c = tid;
      r.refid = end;
      iVar1 = cram_set_option(*(cram_fd **)&idx->n_lvls,CRAM_OPT_RANGE,&local_4c);
      if (iVar1 != 0) {
        free((void *)r._4_8_);
        return (hts_itr_t *)0x0;
      }
      *(undefined8 *)(r._4_8_ + 0x28) = 0;
      *(int *)(r._4_8_ + 4) = tid;
      *(int *)(r._4_8_ + 8) = beg;
      *(int *)(r._4_8_ + 0xc) = end;
    }
    idx_local = (hts_idx_t *)r._4_8_;
  }
  return (hts_itr_t *)idx_local;
}

Assistant:

static hts_itr_t *cram_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    const hts_cram_idx_t *cidx = (const hts_cram_idx_t *) idx;
    hts_itr_t *iter = (hts_itr_t *) calloc(1, sizeof(hts_itr_t));
    if (iter == NULL) return NULL;

    // Cons up a dummy iterator for which hts_itr_next() will simply invoke
    // the readrec function:
    iter->read_rest = 1;
    iter->off = NULL;
    iter->bins.a = NULL;
    iter->readrec = readrec;

    if (tid >= 0) {
        cram_range r = { tid, beg+1, end };
        if (cram_set_option(cidx->cram, CRAM_OPT_RANGE, &r) != 0) { free(iter); return NULL; }
        iter->curr_off = 0;
        // The following fields are not required by hts_itr_next(), but are
        // filled in in case user code wants to look at them.
        iter->tid = tid;
        iter->beg = beg;
        iter->end = end;
    }
    else switch (tid) {
    case HTS_IDX_REST:
        iter->curr_off = 0;
        break;
    case HTS_IDX_NONE:
        iter->curr_off = 0;
        iter->finished = 1;
        break;
    default:
        fprintf(stderr, "[cram_itr_query] tid=%d not implemented for CRAM files -- Exiting\n", tid);
        abort();
        break;
    }

    return iter;
}